

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void InitPalette(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  FWadLump palump;
  BYTE pal [768];
  
  iVar2 = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0);
  if (iVar2 < 0) {
LAB_0048ba57:
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
    if (-1 < iVar2) {
      iVar3 = FWadCollection::LumpLength(&Wads,iVar2);
      if (0x2ff < iVar3) {
        bVar4 = true;
        goto LAB_0048ba93;
      }
    }
  }
  else {
    iVar3 = FWadCollection::LumpLength(&Wads,iVar2);
    if (iVar3 < 0x300) goto LAB_0048ba57;
    bVar4 = false;
LAB_0048ba93:
    bVar1 = FixBuildPalette(pal,iVar2,bVar4);
    bVar4 = true;
    if (bVar1) goto LAB_0048bad8;
  }
  FWadCollection::OpenLumpName(&palump,&Wads,"PLAYPAL");
  FWadLump::Read(&palump,pal,0x300);
  FWadLump::~FWadLump(&palump);
  bVar4 = false;
LAB_0048bad8:
  FPalette::SetPalette(&GPalette,pal);
  FPalette::MakeGoodRemap(&GPalette);
  FColorMatcher::SetPalette(&ColorMatcher,(DWORD *)&GPalette);
  if ((!bVar4) && (GPalette.Remap[0] == '\0')) {
    iVar2 = BestColor((uint32 *)&GPalette,(uint)GPalette.BaseColors[0].field_0.field_0.r,
                      (uint)GPalette.BaseColors[0].field_0.field_0.g,
                      (uint)GPalette.BaseColors[0].field_0.field_0.b,1,0xff);
    GPalette.Remap[0] = (BYTE)iVar2;
  }
  R_InitColormaps();
  return;
}

Assistant:

void InitPalette ()
{
	BYTE pal[768];
	bool usingBuild = false;
	int lump;

	if ((lump = Wads.CheckNumForFullName ("palette.dat")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, false);
	}
	else if ((lump = Wads.CheckNumForFullName ("blood.pal")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, true);
	}

	if (!usingBuild)
	{
		FWadLump palump = Wads.OpenLumpName ("PLAYPAL");
		palump.Read (pal, 768);
	}

	GPalette.SetPalette (pal);
	GPalette.MakeGoodRemap ();
	ColorMatcher.SetPalette ((DWORD *)GPalette.BaseColors);

	// The BUILD engine already has a transparent color, so it doesn't need any remapping.
	if (!usingBuild)
	{
		if (GPalette.Remap[0] == 0)
		{ // No duplicates, so settle for something close to color 0
			GPalette.Remap[0] = BestColor ((DWORD *)GPalette.BaseColors,
				GPalette.BaseColors[0].r, GPalette.BaseColors[0].g, GPalette.BaseColors[0].b, 1, 255);
		}
	}

	// Colormaps have to be initialized before actors are loaded,
	// otherwise Powerup.Colormap will not work.
	R_InitColormaps ();
}